

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.h
# Opt level: O0

int WebPIsAlphaMode(WEBP_CSP_MODE mode)

{
  int iVar1;
  WEBP_CSP_MODE in_EDI;
  bool bVar2;
  
  bVar2 = true;
  if ((((in_EDI != MODE_RGBA) && (bVar2 = true, in_EDI != MODE_BGRA)) &&
      (bVar2 = true, in_EDI != MODE_ARGB)) &&
     ((bVar2 = true, in_EDI != MODE_RGBA_4444 && (bVar2 = true, in_EDI != MODE_YUVA)))) {
    iVar1 = WebPIsPremultipliedMode(in_EDI);
    bVar2 = iVar1 != 0;
  }
  return (int)bVar2;
}

Assistant:

static WEBP_INLINE int WebPIsAlphaMode(WEBP_CSP_MODE mode) {
  return (mode == MODE_RGBA || mode == MODE_BGRA || mode == MODE_ARGB ||
          mode == MODE_RGBA_4444 || mode == MODE_YUVA ||
          WebPIsPremultipliedMode(mode));
}